

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPUState.cpp
# Opt level: O0

void __thiscall CPUState::setAccumulator(CPUState *this,uint16_t newValue,bool ignoreRegisterSize)

{
  bool bVar1;
  bool ignoreRegisterSize_local;
  uint16_t newValue_local;
  CPUState *this_local;
  
  if (ignoreRegisterSize) {
    this->m_Accumulator = newValue;
  }
  else {
    bVar1 = areFlagsSet(this,' ');
    if (bVar1) {
      this->m_Accumulator = (this->m_Accumulator & 0xff00) + (newValue & 0xff);
    }
    else {
      this->m_Accumulator = newValue;
    }
  }
  return;
}

Assistant:

void CPUState::setAccumulator(uint16_t newValue, bool ignoreRegisterSize) {
    if (ignoreRegisterSize) {
        m_Accumulator = newValue;
    } else {
        if (areFlagsSet(MEMORY_SELECT)) {
            //set only the lower byte of m_Accumulator
            m_Accumulator = (m_Accumulator & 0xFF00) + (newValue & 0x00FF);
        } else {
            m_Accumulator = newValue;
        }
    }
}